

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.cpp
# Opt level: O1

void __thiscall OpenMD::OpenMDBitSet::flip(OpenMDBitSet *this,size_t fromIndex,size_t toIndex)

{
  long lVar1;
  size_t sVar2;
  uint uVar3;
  long lVar4;
  size_t sVar5;
  
  sVar2 = fromIndex + 0x3f;
  if (-1 < (long)fromIndex) {
    sVar2 = fromIndex;
  }
  lVar1 = (long)(this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar3 = (uint)fromIndex & 0x3f;
  sVar5 = toIndex + 0x3f;
  if (-1 < (long)toIndex) {
    sVar5 = toIndex;
  }
  lVar4 = lVar1 + ((long)sVar2 >> 6) * 8 +
          (ulong)((fromIndex & 0x800000000000003f) < 0x8000000000000001) * 8 + -8;
  std::transform<std::_Bit_iterator,std::_Bit_iterator,std::logical_not<bool>>
            (lVar4,uVar3,
             lVar1 + ((long)sVar5 >> 6) * 8 +
             (ulong)((toIndex & 0x800000000000003f) < 0x8000000000000001) * 8 + -8,
             (uint)toIndex & 0x3f,lVar4,uVar3);
  return;
}

Assistant:

void OpenMDBitSet::flip(size_t fromIndex, size_t toIndex) {
    assert(fromIndex <= toIndex);
    assert(fromIndex >= 0);
    assert(toIndex <= size());
    std::vector<bool>::iterator first = bitset_.begin() + fromIndex;
    std::vector<bool>::iterator last  = bitset_.begin() + toIndex;

    std::transform(first, last, first, std::logical_not<bool>());
  }